

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O1

Vec_Int_t * Abc_NtkPrecomputeCellPairs(Mio_Cell2_t *pCells,int nCells)

{
  uint uVar1;
  int iVar2;
  word wVar3;
  int iVar4;
  Vec_Int_t *p;
  int *piVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  uint Entry;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  word wVar12;
  ulong uVar13;
  uint uVar14;
  long lVar16;
  long lVar17;
  long lVar18;
  int Perm [7];
  int nPerms [7];
  int *pPerm [7];
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  ulong local_f8;
  ulong local_e0;
  byte abStack_a8 [4];
  byte local_a4 [28];
  int aiStack_88 [8];
  long alStack_68 [7];
  ulong uVar15;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  piVar5 = (int *)malloc(4000);
  p->pArray = piVar5;
  lVar17 = 1;
  do {
    piVar5 = Extra_PermSchedule((int)lVar17);
    alStack_68[lVar17] = (long)piVar5;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 7);
  lVar17 = 1;
  do {
    iVar4 = Extra_Factorial((int)lVar17);
    aiStack_88[lVar17] = iVar4;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 7);
  if (nCells < 3) {
    lVar17 = -1;
    local_f8 = 0;
    lVar16 = -1;
  }
  else {
    local_f8 = 0;
    local_108 = -1;
    uVar13 = 2;
    local_10c = -1;
    do {
      uVar1 = *(uint *)&pCells[uVar13].field_0x10;
      uVar14 = uVar1 >> 0x1c;
      uVar15 = (ulong)uVar14;
      uVar10 = 0;
      do {
        if (uVar10 == uVar15) {
          uVar9 = ~pCells[uVar13].uTruth;
        }
        else {
          bVar7 = (byte)(1 << ((byte)uVar10 & 0x1f));
          uVar9 = (s_Truths6[uVar10] & pCells[uVar13].uTruth) >> (bVar7 & 0x3f) |
                  pCells[uVar13].uTruth << (bVar7 & 0x3f) & s_Truths6[uVar10];
        }
        local_100 = -1;
        local_e0 = 0xffffffffffffffff;
        uVar11 = 2;
        Entry = 0xffffffff;
        local_104 = -1;
        do {
          if (uVar14 == *(uint *)&pCells[uVar11].field_0x10 >> 0x1c) {
            if ((uVar13 == uVar11) || (pCells[uVar13].uTruth != pCells[uVar11].uTruth)) {
              if (0xfffffff < uVar1) {
                uVar6 = 0;
                do {
                  *(int *)(local_a4 + (uVar6 - 1) * 4) = (int)uVar6;
                  uVar6 = uVar6 + 1;
                } while (uVar15 != uVar6);
              }
              wVar3 = pCells[uVar11].uTruth;
              iVar4 = aiStack_88[uVar15];
              wVar12 = wVar3;
              if (0 < (long)iVar4) {
                lVar17 = 0;
                do {
                  if ((uVar9 == wVar12) && (uVar6 = pCells[uVar11].AreaW, uVar6 < local_e0)) {
                    Entry = 0;
                    if (0xfffffff < uVar1) {
                      uVar8 = 0;
                      Entry = 0;
                      do {
                        Entry = Entry | (int)uVar8 << ((local_a4[(uVar8 - 1) * 4] & 7) << 2);
                        uVar8 = uVar8 + 1;
                      } while (uVar15 != uVar8);
                    }
                    local_100 = (int)pCells[uVar13].AreaW - (int)uVar6;
                    local_104 = (int)uVar11;
                    local_e0 = uVar6;
                  }
                  if (iVar4 != 1) {
                    iVar2 = *(int *)(alStack_68[uVar15] + lVar17 * 4);
                    lVar16 = (long)iVar2;
                    bVar7 = (byte)(1L << ((byte)iVar2 & 0x3f));
                    wVar12 = (wVar12 & s_PMasks[lVar16][2]) >> (bVar7 & 0x3f) |
                             (s_PMasks[lVar16][1] & wVar12) << (bVar7 & 0x3f) |
                             s_PMasks[lVar16][0] & wVar12;
                    iVar2 = *(int *)(local_a4 + (lVar16 + -1) * 4);
                    *(int *)(local_a4 + (lVar16 + -1) * 4) = aiStack_88[lVar16 + -7];
                    aiStack_88[lVar16 + -7] = iVar2;
                  }
                  lVar17 = lVar17 + 1;
                } while (lVar17 != iVar4);
              }
              if (wVar12 != wVar3) {
                __assert_fail("tCur == pCells[k].uTruth",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmArea.c"
                              ,0x6f,"Vec_Int_t *Abc_NtkPrecomputeCellPairs(Mio_Cell2_t *, int)");
              }
            }
            else {
              local_f8 = (ulong)((int)local_f8 + 1);
              local_10c = (int)uVar13;
              local_108 = (int)uVar11;
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 != (uint)nCells);
        Vec_IntPush(p,local_104);
        Vec_IntPush(p,Entry);
        Vec_IntPush(p,local_100);
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar14 + 1);
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)nCells);
    lVar17 = (long)local_10c;
    lVar16 = (long)local_108;
  }
  lVar18 = 1;
  do {
    if ((void *)alStack_68[lVar18] != (void *)0x0) {
      free((void *)alStack_68[lVar18]);
      alStack_68[lVar18] = 0;
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 7);
  if ((int)local_f8 != 0) {
    printf("In this library, %d cell pairs have equal functions (for example, %s and %s).\n",
           (ulong)(uint)((int)(local_f8 >> 0x1f) + (int)local_f8 >> 1),pCells[lVar17].pName,
           pCells[lVar16].pName);
  }
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Precompute cell parameters.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Abc_NtkPrecomputeCellPairs( Mio_Cell2_t * pCells, int nCells )
{
    Vec_Int_t * vInfo = Vec_IntAlloc( 1000 );
    word iBestArea, tCur, iThis;
    int * pPerm[7], nPerms[7], Perm[7], * Perm1, * Perm2;
    int iBestCell, iBestPerm, iBestDiff;
    int i, k, n, v, p, Count = 0;
    int iGate1 = -1, iGate2 = -1;

    for ( i = 1; i <= 6; i++ )
        pPerm[i] = Extra_PermSchedule( i );
    for ( i = 1; i <= 6; i++ )
        nPerms[i] = Extra_Factorial( i );

    for ( i = 2; i < nCells; i++ )
    {
        int nFanins = pCells[i].nFanins;
        for ( n = 0; n <= nFanins; n++ )
        {
            // get the truth table
            iThis = (n == nFanins) ? ~pCells[i].uTruth : Abc_Tt6Flip(pCells[i].uTruth, n);
            // init the comparison
            iBestArea = ~((word)0);
            iBestCell = iBestPerm = iBestDiff = -1;
            // iterate through cells
            for ( k = 2; k < nCells; k++ )
            {
                if ( nFanins != (int)pCells[k].nFanins )
                    continue;
                if ( i != k && pCells[i].uTruth == pCells[k].uTruth )
                {
                    iGate1 = i;
                    iGate2 = k;
                    Count++;
                    continue;
                }
                // set unit permutation
                for ( v = 0; v < nFanins; v++ )
                    Perm[v] = v;
                // go through all permutation of Cell[k]
                tCur = pCells[k].uTruth;
                for ( p = 0; p < nPerms[nFanins]; p++ )
                {
                    if ( iThis == tCur && iBestArea > pCells[k].AreaW ) 
                    {
                        iBestArea = pCells[k].AreaW;
                        iBestCell = k;
                        iBestPerm = 0;
                        for ( v = 0; v < nFanins; v++ )
                            iBestPerm |= (v << (Perm[v] << 2));
                        iBestDiff = (pCells[i].AreaW >= pCells[k].AreaW) ? (int)(pCells[i].AreaW - pCells[k].AreaW) : -(int)(pCells[k].AreaW - pCells[i].AreaW);
                    }
                    if ( nPerms[nFanins] == 1 )
                        continue;
                    // update
                    tCur  = Abc_Tt6SwapAdjacent( tCur, pPerm[nFanins][p] );
                    Perm1 = Perm + pPerm[nFanins][p];
                    Perm2 = Perm1 + 1;
                    ABC_SWAP( int, *Perm1, *Perm2 );
                }
                assert( tCur == pCells[k].uTruth );
            }
            Vec_IntPushThree( vInfo, iBestCell, iBestPerm, iBestDiff );
        }
    }

    for ( i = 1; i <= 6; i++ )
        ABC_FREE( pPerm[i] );
    if ( Count )
        printf( "In this library, %d cell pairs have equal functions (for example, %s and %s).\n", Count/2, pCells[iGate1].pName, pCells[iGate2].pName );
    return vInfo;
}